

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O0

void vkt::sr::anon_unknown_0::genGatherPrograms
               (SourceCollections *programCollection,GatherCaseBaseParams *baseParams,
               vector<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
               *iterations)

{
  GatherType GVar1;
  bool bVar2;
  bool requireGpuShader5;
  DataType samplerType_00;
  size_type sVar3;
  ProgramSources *pPVar4;
  const_reference gatherArgs_00;
  bool usePixCoord_00;
  bool local_176;
  bool local_169;
  string local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  undefined1 local_120 [8];
  FragmentSource frag;
  string funcCall;
  GatherArgs *gatherArgs;
  int iterNdx;
  undefined1 local_a8 [8];
  VertexSource vert;
  int numDims;
  DataType samplerType;
  bool isShadow;
  bool isDynamicOffset;
  bool useNormalizedCoord;
  bool usePixCoord;
  IVec2 *local_68;
  IVec2 *offsetRange;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string refZExpr;
  int numIterations;
  vector<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
  *iterations_local;
  GatherCaseBaseParams *baseParams_local;
  SourceCollections *programCollection_local;
  
  sVar3 = std::
          vector<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
          ::size(iterations);
  refZExpr.field_2._12_4_ = (undefined4)sVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_48,"v_normalizedCoord.x",&local_49);
  std::allocator<char>::~allocator(&local_49);
  if (baseParams->offsetSize == OFFSETSIZE_IMPLEMENTATION_MAXIMUM) {
    tcu::Vector<int,_2>::Vector((Vector<int,_2> *)&samplerType,0);
  }
  else {
    getOffsetRange((anon_unknown_0 *)&samplerType,baseParams->offsetSize);
  }
  local_68 = (IVec2 *)&samplerType;
  usePixCoord_00 = baseParams->gatherType == GATHERTYPE_OFFSET_DYNAMIC;
  local_169 = true;
  if (!usePixCoord_00) {
    local_169 = isDepthFormat(&baseParams->textureFormat);
  }
  GVar1 = baseParams->gatherType;
  bVar2 = isDepthFormat(&baseParams->textureFormat);
  samplerType_00 = getSamplerType(baseParams->textureType,&baseParams->textureFormat);
  vert.super_ShaderSource.source.field_2._12_4_ =
       getNumTextureSamplingDimensions(baseParams->textureType);
  requireGpuShader5 =
       anon_unknown_0::requireGpuShader5(baseParams->gatherType,baseParams->offsetSize);
  local_176 = true;
  if (GVar1 != GATHERTYPE_OFFSET_DYNAMIC) {
    local_176 = bVar2;
  }
  genVertexShaderSource
            ((VertexSource *)local_a8,requireGpuShader5,
             vert.super_ShaderSource.source.field_2._12_4_,local_176);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&iterNdx,"vert",(allocator<char> *)((long)&gatherArgs + 7));
  pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,(string *)&iterNdx);
  glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)local_a8);
  std::__cxx11::string::~string((string *)&iterNdx);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gatherArgs + 7));
  for (gatherArgs._0_4_ = 0; (int)gatherArgs < (int)refZExpr.field_2._12_4_;
      gatherArgs._0_4_ = (int)gatherArgs + 1) {
    gatherArgs_00 =
         std::
         vector<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
         ::operator[](iterations,(long)(int)gatherArgs);
    genGatherFuncCall((string *)((long)&frag.super_ShaderSource.source.field_2 + 8),
                      baseParams->gatherType,&baseParams->textureFormat,gatherArgs_00,
                      (string *)local_48,local_68,1,baseParams->offsetSize,baseParams->sparseCase);
    bVar2 = anon_unknown_0::requireGpuShader5(baseParams->gatherType,baseParams->offsetSize);
    genFragmentShaderSource
              ((FragmentSource *)local_120,bVar2,vert.super_ShaderSource.source.field_2._12_4_,
               samplerType_00,(string *)((long)&frag.super_ShaderSource.source.field_2 + 8),
               local_169,usePixCoord_00,baseParams->offsetSize,baseParams->sparseCase);
    de::toString<int>(&local_160,(int *)&gatherArgs);
    std::operator+(&local_140,"frag_",&local_160);
    pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&programCollection->glslSources,&local_140);
    glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)local_120);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_160);
    glu::FragmentSource::~FragmentSource((FragmentSource *)local_120);
    std::__cxx11::string::~string
              ((string *)(frag.super_ShaderSource.source.field_2._M_local_buf + 8));
  }
  glu::VertexSource::~VertexSource((VertexSource *)local_a8);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void genGatherPrograms (vk::SourceCollections& programCollection, const GatherCaseBaseParams& baseParams, const vector<GatherArgs>& iterations)
{
	const int					numIterations		= (int)iterations.size();
	const string				refZExpr			= "v_normalizedCoord.x";
	const IVec2&				offsetRange			= baseParams.offsetSize != OFFSETSIZE_IMPLEMENTATION_MAXIMUM ? getOffsetRange(baseParams.offsetSize) : IVec2(0);
	const bool					usePixCoord			= baseParams.gatherType == GATHERTYPE_OFFSET_DYNAMIC;
	const bool					useNormalizedCoord	= usePixCoord || isDepthFormat(baseParams.textureFormat);
	const bool					isDynamicOffset		= baseParams.gatherType == GATHERTYPE_OFFSET_DYNAMIC;
	const bool					isShadow			= isDepthFormat(baseParams.textureFormat);
	const glu::DataType			samplerType			= getSamplerType(baseParams.textureType, baseParams.textureFormat);
	const int					numDims				= getNumTextureSamplingDimensions(baseParams.textureType);
	glu::VertexSource			vert				= genVertexShaderSource(requireGpuShader5(baseParams.gatherType, baseParams.offsetSize), numDims, isDynamicOffset || isShadow);

	programCollection.glslSources.add("vert") << vert;

	for (int iterNdx = 0; iterNdx < numIterations; iterNdx++)
	{
		const GatherArgs&		gatherArgs			= iterations[iterNdx];
		const string			funcCall			= genGatherFuncCall(baseParams.gatherType, baseParams.textureFormat, gatherArgs, refZExpr, offsetRange, 1, baseParams.offsetSize, baseParams.sparseCase);
		glu::FragmentSource		frag				= genFragmentShaderSource(requireGpuShader5(baseParams.gatherType, baseParams.offsetSize), numDims, samplerType, funcCall, useNormalizedCoord, usePixCoord, baseParams.offsetSize, baseParams.sparseCase);

		programCollection.glslSources.add("frag_" + de::toString(iterNdx)) << frag;
	}
}